

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

bool __thiscall
cmMakefileTargetGenerator::CheckUseResponseFileForObjects(cmMakefileTargetGenerator *this,string *l)

{
  bool bVar1;
  cmValue cVar2;
  size_t sVar3;
  ulong uVar4;
  string *obj;
  pointer pbVar5;
  string responseVar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"CMAKE_",l);
  std::operator+(&local_50,&local_30,"_USE_RESPONSE_FILE_FOR_OBJECTS");
  std::__cxx11::string::~string((string *)&local_30);
  cVar2 = cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&local_50);
  if ((cVar2.Value == (string *)0x0) || ((cVar2.Value)->_M_string_length == 0)) {
    sVar3 = cmSystemTools::CalculateCommandLineLengthLimit();
    if (sVar3 != 0) {
      uVar4 = 0;
      for (pbVar5 = (this->Objects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar5 != (this->Objects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
        uVar4 = uVar4 + pbVar5->_M_string_length + 3;
      }
      for (pbVar5 = (this->ExternalObjects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar5 != (this->ExternalObjects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
        uVar4 = uVar4 + pbVar5->_M_string_length + 3;
      }
      bVar1 = true;
      if (sVar3 >> 1 < uVar4) goto LAB_003ba62f;
    }
    bVar1 = false;
  }
  else {
    bVar1 = cmIsOn((cmValue)0x3ba5cb);
  }
LAB_003ba62f:
  std::__cxx11::string::~string((string *)&local_50);
  return bVar1;
}

Assistant:

bool cmMakefileTargetGenerator::CheckUseResponseFileForObjects(
  std::string const& l) const
{
  // Check for an explicit setting one way or the other.
  std::string const responseVar =
    "CMAKE_" + l + "_USE_RESPONSE_FILE_FOR_OBJECTS";
  if (cmValue val = this->Makefile->GetDefinition(responseVar)) {
    if (!val->empty()) {
      return cmIsOn(val);
    }
  }

  // Check for a system limit.
  if (size_t const limit = cmSystemTools::CalculateCommandLineLengthLimit()) {
    // Compute the total length of our list of object files with room
    // for argument separation and quoting.  This does not convert paths
    // relative to CMAKE_CURRENT_BINARY_DIR like the final list will be, so
    // the actual list will likely be much shorter than this.  However, in
    // the worst case all objects will remain as absolute paths.
    size_t length = 0;
    for (std::string const& obj : this->Objects) {
      length += obj.size() + 3;
    }
    for (std::string const& ext_obj : this->ExternalObjects) {
      length += ext_obj.size() + 3;
    }

    // We need to guarantee room for both objects and libraries, so
    // if the objects take up more than half then use a response file
    // for them.
    if (length > (limit / 2)) {
      return true;
    }
  }

  // We do not need a response file for objects.
  return false;
}